

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_entry.cpp
# Opt level: O2

void __thiscall
duckdb::DependencyDependentEntry::~DependencyDependentEntry(DependencyDependentEntry *this)

{
  ~DependencyDependentEntry(this);
  operator_delete(this);
  return;
}

Assistant:

DependencyEntry::~DependencyEntry() {
}